

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cpp
# Opt level: O1

int tracy::elf_uncompress_zdebug
              (backtrace_state *state,uchar *compressed,size_t compressed_size,
              uint16_t *zdebug_table,backtrace_error_callback error_callback,void *data,
              uchar **uncompressed,size_t *uncompressed_size)

{
  int iVar1;
  long lVar2;
  uint16_t *zdebug_table_00;
  int iVar3;
  uchar *pout;
  
  *uncompressed = (uchar *)0x0;
  *uncompressed_size = 0;
  iVar3 = 1;
  if ((0xb < compressed_size) && (*(int *)compressed == 0x42494c5a)) {
    lVar2 = 0;
    pout = (uchar *)0x0;
    do {
      pout = (uchar *)((ulong)compressed[lVar2 + 4] | (long)pout << 8);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    zdebug_table_00 = (uint16_t *)backtrace_alloc(state,(size_t)pout,error_callback,data);
    if (zdebug_table_00 == (uint16_t *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar1 = elf_zlib_inflate_and_verify
                        ((tracy *)(compressed + 0xc),(uchar *)(compressed_size - 0xc),
                         (size_t)zdebug_table,zdebug_table_00,pout,(size_t)data);
      if (iVar1 != 0) {
        *uncompressed = (uchar *)zdebug_table_00;
        *uncompressed_size = (size_t)pout;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
elf_uncompress_zdebug (struct backtrace_state *state,
		       const unsigned char *compressed, size_t compressed_size,
		       uint16_t *zdebug_table,
		       backtrace_error_callback error_callback, void *data,
		       unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t sz;
  size_t i;
  unsigned char *po;

  *uncompressed = NULL;
  *uncompressed_size = 0;

  /* The format starts with the four bytes ZLIB, followed by the 8
     byte length of the uncompressed data in big-endian order,
     followed by a zlib stream.  */

  if (compressed_size < 12 || memcmp (compressed, "ZLIB", 4) != 0)
    return 1;

  sz = 0;
  for (i = 0; i < 8; i++)
    sz = (sz << 8) | compressed[i + 4];

  if (*uncompressed != NULL && *uncompressed_size >= sz)
    po = *uncompressed;
  else
    {
      po = (unsigned char *) backtrace_alloc (state, sz, error_callback, data);
      if (po == NULL)
	return 0;
    }

  if (!elf_zlib_inflate_and_verify (compressed + 12, compressed_size - 12,
				    zdebug_table, po, sz))
    return 1;

  *uncompressed = po;
  *uncompressed_size = sz;

  return 1;
}